

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_extswsli1(DisasContext_conflict10 *ctx)

{
  DisasContext_conflict10 *ctx_local;
  
  gen_extswsli(ctx,1);
  return;
}

Assistant:

static void gen_extswsli1(DisasContext *ctx)
{
    gen_extswsli(ctx, 1);
}